

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O3

DdNode * Aig_ManInitStateVarMap(DdManager *dd,Aig_Man_t *p,int fVerbose)

{
  ulong uVar1;
  uint uVar2;
  DdNode **ppDVar3;
  DdNode **x;
  DdNode **y;
  DdNode *pDVar4;
  ulong uVar5;
  int iVar6;
  size_t __size;
  long lVar7;
  DdNode *f;
  
  __size = (long)dd->size << 3;
  x = (DdNode **)malloc(__size);
  y = (DdNode **)malloc(__size);
  pDVar4 = dd->one;
  Cudd_Ref(pDVar4);
  uVar2 = p->nRegs;
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    Cudd_SetVarMap(dd,x,y,uVar2);
    if (x == (DdNode **)0x0) goto LAB_008221ef;
  }
  else {
    lVar7 = 0;
    f = pDVar4;
    do {
      uVar2 = p->nTruePis;
      uVar1 = lVar7 + (ulong)uVar2;
      iVar6 = (int)uVar1;
      if ((iVar6 < 0) || (p->vCis->nSize <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      ppDVar3 = dd->vars;
      pDVar4 = ppDVar3[uVar1 & 0xffffffff];
      x[lVar7] = pDVar4;
      y[lVar7] = ppDVar3[(int)((int)uVar5 + uVar2 + (int)lVar7)];
      pDVar4 = Cudd_bddAnd(dd,f,(DdNode *)((ulong)pDVar4 ^ 1));
      Cudd_Ref(pDVar4);
      Cudd_RecursiveDeref(dd,f);
      lVar7 = lVar7 + 1;
      uVar5 = (ulong)p->nRegs;
      f = pDVar4;
    } while (lVar7 < (long)uVar5);
    Cudd_SetVarMap(dd,x,y,p->nRegs);
  }
  free(x);
LAB_008221ef:
  if (y != (DdNode **)0x0) {
    free(y);
  }
  Cudd_Deref(pDVar4);
  return pDVar4;
}

Assistant:

DdNode * Aig_ManInitStateVarMap( DdManager * dd, Aig_Man_t * p, int fVerbose )
{
    DdNode ** pbVarsX, ** pbVarsY;
    DdNode * bTemp, * bProd;
    Aig_Obj_t * pLatch;
    int i;

    // set the variable mapping for Cudd_bddVarMap()
    pbVarsX = ABC_ALLOC( DdNode *, dd->size );
    pbVarsY = ABC_ALLOC( DdNode *, dd->size );
    bProd = (dd)->one;         Cudd_Ref( bProd );
    Saig_ManForEachLo( p, pLatch, i )
    {
        pbVarsX[i] = dd->vars[ Saig_ManPiNum(p) + i ];
        pbVarsY[i] = dd->vars[ Saig_ManCiNum(p) + i ];
        // get the initial value of the latch
        bProd = Cudd_bddAnd( dd, bTemp = bProd, Cudd_Not(pbVarsX[i]) );      Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bTemp ); 
    }
    Cudd_SetVarMap( dd, pbVarsX, pbVarsY, Saig_ManRegNum(p) );
    ABC_FREE( pbVarsX );
    ABC_FREE( pbVarsY );

    Cudd_Deref( bProd );
    return bProd;
}